

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O3

void do_data(char *infile,char *outfile)

{
  uchar uVar1;
  bool bVar2;
  bool bVar3;
  permonst *ppVar4;
  FILE *pFVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  undefined8 extraout_RAX;
  long lVar12;
  size_t sVar13;
  byte *pbVar14;
  char *extraout_RAX_00;
  char cVar15;
  undefined8 uVar16;
  byte *pbVar17;
  char *__filename;
  uint uVar18;
  ulong uVar19;
  msghdr *__filename_00;
  int *unaff_RBP;
  byte bVar20;
  byte bVar21;
  long lVar22;
  long *plVar23;
  qthdr *pqVar24;
  qthdr *__filename_01;
  char *__filename_02;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  char *unaff_R12;
  char *unaff_R13;
  permonst *ppVar29;
  char cVar30;
  char *pcVar31;
  qthdr *__filename_03;
  char *unaff_R15;
  msghdr *pmVar32;
  msghdr *__filename_04;
  char (*__s2) [3];
  char tempfile [256];
  char acStack_7a0 [256];
  long alStack_6a0 [33];
  char *pcStack_598;
  char *pcStack_590;
  char *pcStack_588;
  char *pcStack_580;
  msghdr *pmStack_578;
  code *pcStack_570;
  char *pcStack_568;
  msghdr *pmStack_560;
  char *pcStack_558;
  char *pcStack_550;
  qthdr *pqStack_548;
  msghdr *pmStack_540;
  code *pcStack_538;
  int iStack_524;
  char acStack_520 [264];
  qthdr *pqStack_418;
  char *pcStack_410;
  char *pcStack_408;
  qthdr *pqStack_400;
  msghdr *pmStack_3f8;
  code *pcStack_3f0;
  ulong uStack_3e0;
  char *pcStack_3d8;
  char *pcStack_3d0;
  qthdr *pqStack_3c8;
  msghdr *pmStack_3c0;
  code *pcStack_3b8;
  time_t tStack_3a8;
  char acStack_3a0 [64];
  char acStack_360 [64];
  undefined1 auStack_320 [64];
  char acStack_2e0 [256];
  qthdr *pqStack_1e0;
  char *pcStack_1d8;
  char *pcStack_1d0;
  qthdr *pqStack_1c8;
  msghdr *pmStack_1c0;
  undefined8 uStack_1b8;
  char *pcStack_1b0;
  char *pcStack_1a8;
  char *pcStack_1a0;
  qthdr *pqStack_198;
  msghdr *pmStack_190;
  code *pcStack_188;
  char *pcStack_178;
  char *pcStack_170;
  char *pcStack_168;
  char *pcStack_160;
  msghdr *pmStack_158;
  code *pcStack_150;
  uint local_13c;
  char local_138 [264];
  
  pcStack_150 = (code *)0x109d1c;
  sprintf(local_138,"%s.%s",outfile,"tmp");
  pcStack_150 = (code *)0x109d2b;
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_00109ff2:
    pcStack_150 = (code *)0x109ffa;
    do_data_cold_4();
LAB_00109ffa:
    pcStack_150 = (code *)0x10a002;
    do_data_cold_3();
    pmVar32 = (msghdr *)unaff_R15;
  }
  else {
    pcStack_150 = (code *)0x109d4a;
    ofp = (FILE *)fopen(outfile,"w+");
    if ((FILE *)ofp == (FILE *)0x0) goto LAB_00109ffa;
    pcStack_150 = (code *)0x109d6b;
    tfp = (FILE *)fopen(local_138,"w+");
    pmVar32 = (msghdr *)unaff_R15;
    if ((FILE *)tfp != (FILE *)0x0) {
      pcStack_150 = (code *)0x109d99;
      fprintf((FILE *)ofp,"%s%08lx\n",
              "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
      unaff_R13 = "%d\n";
      unaff_R12 = "%ld,";
      unaff_R15 = (char *)0x0;
      do {
        unaff_RBP = (int *)0x0;
        while( true ) {
          do {
            pcStack_150 = (code *)0x109dc7;
            pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
            pFVar5 = ofp;
            iVar6 = (int)unaff_RBP;
            if (pcVar9 == (char *)0x0) {
              if (iVar6 != 0) {
                pcStack_150 = (code *)0x109e8d;
                fprintf((FILE *)ofp,"%d\n",unaff_RBP);
              }
              pFVar5 = ofp;
              pcStack_150 = (code *)0x109ea0;
              lVar10 = ftell((FILE *)tfp);
              pcStack_150 = (code *)0x109eb6;
              fprintf((FILE *)pFVar5,".\n%ld,%d\n",lVar10,0);
              pcStack_150 = (code *)0x109ec2;
              infile = (char *)ftell((FILE *)ofp);
              pcStack_150 = (code *)0x109ed1;
              fclose((FILE *)ifp);
              pcStack_150 = (code *)0x109eeb;
              sprintf(in_line,"rewind of \"%s\"",local_138);
              pcStack_150 = (code *)0x109efb;
              iVar6 = fseek((FILE *)tfp,0,0);
              if (iVar6 == 0) {
                pcStack_150 = (code *)0x109f1b;
                pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
                if (pcVar9 != (char *)0x0) {
                  unaff_R15 = in_line;
                  do {
                    pcStack_150 = (code *)0x109f36;
                    fputs(in_line,(FILE *)ofp);
                    pcStack_150 = (code *)0x109f4a;
                    pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
                  } while (pcVar9 != (char *)0x0);
                }
                pcStack_150 = (code *)0x109f5b;
                fclose((FILE *)tfp);
                pcStack_150 = (code *)0x109f65;
                unlink(local_138);
                pcStack_150 = (code *)0x109f7d;
                sprintf(in_line,"rewind of \"%s\"",outfile);
                pcStack_150 = (code *)0x109f8d;
                iVar6 = fseek((FILE *)ofp,0,0);
                if (iVar6 == 0) {
                  pcStack_150 = (code *)0x109fa9;
                  sprintf(in_line,"header rewrite of \"%s\"",outfile);
                  pcStack_150 = (code *)0x109fc8;
                  iVar6 = fprintf((FILE *)ofp,"%s%08lx\n",
                                  "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n"
                                  ,infile);
                  if (-1 < iVar6) {
                    pcStack_150 = (code *)0x109fd8;
                    fclose((FILE *)ofp);
                    return;
                  }
                }
              }
              pcStack_150 = (code *)0x109ff2;
              do_data_cold_1();
              goto LAB_00109ff2;
            }
          } while (in_line[0] == '#');
          uVar18 = (uint)unaff_R15;
          if (' ' < in_line[0]) break;
          if (uVar18 == 0) {
            unaff_R15 = (char *)0x0;
          }
          else {
            if (iVar6 == 0) {
              pcStack_150 = (code *)0x109e08;
              local_13c = uVar18;
              lVar10 = ftell((FILE *)tfp);
              unaff_R15 = (char *)(ulong)local_13c;
              pcStack_150 = (code *)0x109e26;
              fprintf((FILE *)pFVar5,"%ld,",lVar10);
            }
            pcStack_150 = (code *)0x109e35;
            fputs(in_line,(FILE *)tfp);
            unaff_RBP = (int *)(ulong)(iVar6 + 1);
          }
        }
        if (iVar6 != 0) {
          pcStack_150 = (code *)0x109e5b;
          fprintf((FILE *)ofp,"%d\n",unaff_RBP);
        }
        pcStack_150 = (code *)0x109e6a;
        fputs(in_line,(FILE *)ofp);
        unaff_R15 = (char *)(ulong)(uVar18 + 1);
      } while( true );
    }
  }
  pcVar9 = local_138;
  pcStack_150 = do_dungeon;
  pcVar31 = outfile;
  do_data_cold_2();
  pcStack_188 = (code *)0x10a02c;
  pcStack_178 = outfile;
  pcStack_170 = unaff_R12;
  pcStack_168 = unaff_R13;
  pcStack_160 = infile;
  pmStack_158 = pmVar32;
  pcStack_150 = (code *)unaff_RBP;
  ifp = (FILE *)fopen(pcVar9,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010a131:
    pcStack_188 = (code *)0x10a139;
    do_dungeon_cold_3();
  }
  else {
    pcStack_188 = (code *)0x10a04b;
    ofp = (FILE *)fopen(pcVar31,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      pcStack_188 = (code *)0x10a06a;
      fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
      pcVar31 = in_line;
      pcStack_188 = (code *)0x10a085;
      pcVar11 = fgets(in_line,0x100,(FILE *)ifp);
      if (pcVar11 != (char *)0x0) {
        unaff_RBP = (int *)0x1;
        pmVar32 = (msghdr *)0x4e5241434e494552;
        unaff_R12 = (char *)0x4e4f4954414e5241;
        unaff_R13 = in_line + 0xe;
        do {
          if (in_line[0] != '#') {
            pcVar11 = in_line;
            if (in_line[0] == '%') {
              pcVar11 = in_line + 0xe;
              if (CONCAT53(in_line._9_5_,in_line._6_3_) != 0x4e4f4954414e5241 ||
                  CONCAT44(in_line._5_4_,
                           CONCAT13(in_line[4],CONCAT12(in_line[3],CONCAT11(in_line[2],in_line[1])))
                          ) != 0x4e5241434e494552) {
                pcStack_188 = (code *)0x10a131;
                do_dungeon_cold_1();
                goto LAB_0010a131;
              }
            }
            pcStack_188 = (code *)0x10a0e6;
            fputs(pcVar11,(FILE *)ofp);
          }
          pcStack_188 = (code *)0x10a0fa;
          pcVar11 = fgets(in_line,0x100,(FILE *)ifp);
          unaff_RBP = (int *)(ulong)((int)unaff_RBP + 1);
        } while (pcVar11 != (char *)0x0);
      }
      pcStack_188 = (code *)0x10a10d;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_188 = do_monstr;
  pqVar24 = (qthdr *)pcVar31;
  do_dungeon_cold_2();
  pcVar11 = "w+";
  pmStack_1c0 = (msghdr *)0x10a15b;
  uStack_1b8 = extraout_RAX;
  pcStack_1b0 = pcVar9;
  pcStack_1a8 = unaff_R12;
  pcStack_1a0 = unaff_R13;
  pqStack_198 = (qthdr *)pcVar31;
  pmStack_190 = pmVar32;
  pcStack_188 = (code *)unaff_RBP;
  ofp = (FILE *)fopen((char *)pqVar24,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    pmStack_1c0 = (msghdr *)0x10a17a;
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    pmStack_1c0 = (msghdr *)0x10a197;
    fwrite("#include \"config.h\"\n",0x14,1,(FILE *)ofp);
    pmStack_1c0 = (msghdr *)0x10a1b4;
    fwrite("\nconst int monstr[] = {\n",0x18,1,(FILE *)ofp);
    ppVar29 = mons;
    uVar18 = 0;
    do {
      uVar7 = (uint)ppVar29->mlevel;
      uVar28 = uVar7 * 2 - 0xc >> 2;
      if ((int)uVar7 < 0x32) {
        uVar28 = uVar7;
      }
      uVar7 = ppVar29->geno >> 5 & 2 | ppVar29->geno >> 7 & 1;
      lVar10 = 4;
      uStack_1b8 = CONCAT44(uVar18,(undefined4)uStack_1b8);
      do {
        uVar18 = (uint)ppVar29->mattk[lVar10 + -4].aatyp;
        if ((0xfd < uVar18) || ((0x9400U >> (uVar18 & 0x1f) & 1) != 0)) {
          uVar7 = uVar7 + 1;
          break;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 10);
      uVar18 = (uint)('\x11' < ppVar29->mmove) +
               ((byte)ppVar29->ac >> 7) + uVar7 + (uint)(ppVar29->ac < '\x04');
      lVar10 = 4;
      do {
        uVar1 = ppVar29->mattk[lVar10 + -4].aatyp;
        uVar7 = 0;
        if (uVar1 == 0xfe) {
          uVar7 = ppVar29->mflags2 >> 0x1a & 1;
        }
        uVar18 = ((uVar18 + 1) - (uint)(uVar1 == '\0')) + (uint)(uVar1 == 0xff) + uVar7;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 10);
      lVar10 = 0x13;
      do {
        bVar21 = *(byte *)((long)ppVar29->mattk + lVar10 + -0x12);
        if ((bVar21 < 0x20) && ((0xe0048080U >> (bVar21 & 0x1f) & 1) != 0)) {
          uVar18 = uVar18 + 2;
        }
        else {
          pmStack_1c0 = (msghdr *)0x10a2d1;
          iVar6 = strcmp(ppVar29->mname,"grid bug");
          if (iVar6 != 0) {
            uVar18 = (uVar18 + 1) - (uint)(bVar21 == 0);
          }
        }
        uVar18 = (uVar18 + 1) -
                 (uint)((uint)*(byte *)((long)ppVar29->mattk + lVar10 + -0x11) *
                        (uint)*(byte *)((long)&((permonst *)(ppVar29->mattk + -4))->mname + lVar10)
                       < 0x18);
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x2b);
      pmStack_1c0 = (msghdr *)0x10a2ee;
      iVar6 = strcmp(ppVar29->mname,"leprechaun");
      uVar7 = uVar18 - 2;
      if (iVar6 != 0) {
        uVar7 = uVar18;
      }
      if (uVar7 == 0) {
        uVar28 = uVar28 - 1;
      }
      else if ((int)uVar7 < 6) {
        uVar28 = uVar28 + (int)uVar7 / 3 + 1;
      }
      else {
        uVar28 = uVar28 + (uVar7 >> 1);
      }
      if ((int)uVar28 < 1) {
        uVar28 = 0;
      }
      uVar18 = uStack_1b8._4_4_ + 1;
      uVar16 = 0x20;
      if ((uVar18 & 0xf) == 0) {
        uVar16 = 10;
      }
      pmStack_1c0 = (msghdr *)0x10a366;
      fprintf((FILE *)ofp,"%2d,%c",(ulong)uVar28,uVar16);
      ppVar4 = ppVar29 + 1;
      ppVar29 = ppVar29 + 1;
      if (ppVar4->mlet == '\0') {
        pcVar9 = "\n";
        if ((uVar18 & 0xf) == 0) {
          pcVar9 = "";
        }
        pmStack_1c0 = (msghdr *)0x10a3ad;
        fprintf((FILE *)ofp,"%s};\n",pcVar9);
        pmStack_1c0 = (msghdr *)0x10a3ca;
        fwrite("\n/*monstr.c*/\n",0xe,1,(FILE *)ofp);
        fclose((FILE *)ofp);
        return;
      }
    } while( true );
  }
  pmStack_1c0 = (msghdr *)do_date;
  __filename_01 = pqVar24;
  do_monstr_cold_1();
  tStack_3a8 = 0;
  pcStack_3b8 = (code *)0x10a416;
  pqStack_1e0 = pqVar24;
  pcStack_1d8 = unaff_R12;
  pcStack_1d0 = unaff_R13;
  pqStack_1c8 = (qthdr *)pcVar31;
  pmStack_1c0 = pmVar32;
  ofp = (FILE *)fopen((char *)__filename_01,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    pcStack_3b8 = (code *)0x10a435;
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    pcStack_3b8 = (code *)0x10a442;
    time(&tStack_3a8);
    pcStack_3b8 = (code *)0x10a44a;
    pcVar31 = ctime(&tStack_3a8);
    pcVar9 = acStack_3a0;
    pcStack_3b8 = (code *)0x10a45a;
    strcpy(pcVar9,pcVar31);
    for (; (*pcVar9 != '\0' && (*pcVar9 != '\n')); pcVar9 = pcVar9 + 1) {
    }
    *pcVar9 = '\0';
    if ((char)((ulong)pcVar11 & 0xffffffff) != '\0') {
      pcStack_3b8 = (code *)0x10a48e;
      fprintf((FILE *)ofp,"#define BUILD_DATE \"%s\"\n",acStack_3a0);
      pcStack_3b8 = (code *)0x10a4a8;
      fprintf((FILE *)ofp,"#define BUILD_TIME (%ldL)\n",tStack_3a8);
      pcStack_3b8 = (code *)0x10a4b9;
      fputc(10,(FILE *)ofp);
    }
    pcStack_3b8 = (code *)0x10a4d8;
    fprintf((FILE *)ofp,"#define VERSION_NUMBER 0x%08xU\n",(ulong)version_0 << 8);
    pcStack_3b8 = (code *)0x10a4ef;
    fprintf((FILE *)ofp,"#define VERSION_FEATURES 0x%08xU\n",0);
    pcStack_3b8 = (code *)0x10a50a;
    fprintf((FILE *)ofp,"#define VERSION_SANITY1 0x%08xU\n",(ulong)version_2);
    pcStack_3b8 = (code *)0x10a51b;
    fputc(10,(FILE *)ofp);
    pFVar5 = ofp;
    pcStack_3b8 = (code *)0x10a548;
    sprintf(acStack_2e0,"%d.%d.%d",0,0,1);
    pcStack_3b8 = (code *)0x10a55c;
    fprintf((FILE *)pFVar5,"#define VERSION_STRING \"%s\"\n",acStack_2e0);
    pFVar5 = ofp;
    auStack_320[0] = 0;
    pcStack_3b8 = (code *)0x10a58c;
    sprintf(acStack_360,"%d.%d.%d",0,0,1);
    pcStack_3b8 = (code *)0x10a5af;
    sprintf(acStack_2e0,"%s DynaMoHack%s Version %s - last build %s.","Unix",auStack_320,acStack_360
            ,acStack_3a0);
    pcStack_3b8 = (code *)0x10a5c3;
    fprintf((FILE *)pFVar5,"#define VERSION_ID \\\n \"%s\"\n",acStack_2e0);
    pcStack_3b8 = (code *)0x10a5d4;
    fputc(10,(FILE *)ofp);
    pcStack_3b8 = (code *)0x10a5e0;
    fclose((FILE *)ofp);
    return;
  }
  pcStack_3b8 = do_permonst;
  pqVar24 = __filename_01;
  do_date_cold_1();
  pcVar9 = "w+";
  pcStack_3f0 = (code *)0x10a613;
  uStack_3e0 = (ulong)pcVar11 & 0xffffffff;
  pcStack_3d8 = unaff_R12;
  pcStack_3d0 = unaff_R13;
  pqStack_3c8 = __filename_01;
  pmStack_3c0 = pmVar32;
  pcStack_3b8 = (code *)unaff_RBP;
  ofp = (FILE *)fopen((char *)pqVar24,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    pcStack_3f0 = (code *)0x10a632;
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    pcStack_3f0 = (code *)0x10a64f;
    fwrite("#ifndef PM_H\n#define PM_H\n",0x1a,1,(FILE *)ofp);
    pcStack_3f0 = (code *)0x10a665;
    iVar6 = strcmp("giant ant","playermon");
    if (iVar6 != 0) {
      pcStack_3f0 = (code *)0x10a686;
      fwrite("\n#define\tPM_PLAYERMON\t(-1)",0x1a,1,(FILE *)ofp);
    }
    cVar30 = '\x01';
    uVar19 = 0;
    ppVar29 = mons;
    do {
      pcStack_3f0 = (code *)0x10a6c3;
      fwrite("\n#define\tPM_",0xc,1,(FILE *)ofp);
      pcVar9 = ppVar29->mname;
      if (cVar30 == '5') {
        pcStack_3f0 = (code *)0x10a6e1;
        iVar6 = strncmp(pcVar9,"were",4);
        if (iVar6 == 0) {
          pcStack_3f0 = (code *)0x10a702;
          fwrite("HUMAN_",6,1,(FILE *)ofp);
        }
      }
      pcStack_3f0 = (code *)0x10a712;
      strncpy(&tmpdup_buf,pcVar9,0x7f);
      if (tmpdup_buf != '\0') {
        pcVar9 = &DAT_0014f2b1;
        cVar30 = tmpdup_buf;
        do {
          if ((byte)(cVar30 + 0x9fU) < 0x1a) {
            cVar15 = cVar30 + -0x20;
LAB_0010a73c:
            pcVar9[-1] = cVar15;
          }
          else {
            cVar15 = '_';
            if ((byte)(cVar30 + 0xa5U) < 0xe6) goto LAB_0010a73c;
          }
          cVar30 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while (cVar30 != '\0');
      }
      pcStack_3f0 = (code *)0x10a75e;
      fprintf((FILE *)ofp,"%s\t%d",&tmpdup_buf,uVar19 & 0xffffffff);
      uVar19 = uVar19 + 1;
      ppVar29 = mons + uVar19;
      cVar30 = mons[uVar19].mlet;
      if (cVar30 == '\0') {
        pcStack_3f0 = (code *)0x10a795;
        fprintf((FILE *)ofp,"\n\n#define\tNUMMONS\t%d\n",uVar19 & 0xffffffff);
        pcStack_3f0 = (code *)0x10a7b2;
        fwrite("\n#endif /* PM_H */\n",0x13,1,(FILE *)ofp);
        fclose((FILE *)ofp);
        return;
      }
    } while( true );
  }
  pcStack_3f0 = do_questtxt;
  __filename_00 = (msghdr *)pcVar9;
  __filename_03 = pqVar24;
  do_permonst_cold_1();
  pcVar9 = "r";
  pcStack_538 = (code *)0x10a7f7;
  pqStack_418 = pqVar24;
  pcStack_410 = unaff_R12;
  pcStack_408 = unaff_R13;
  pqStack_400 = __filename_01;
  pmStack_3f8 = pmVar32;
  pcStack_3f0 = (code *)unaff_RBP;
  ifp = (FILE *)fopen((char *)__filename_03,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010ad64:
    pcStack_538 = (code *)0x10ad6c;
    do_questtxt_cold_7();
  }
  else {
    pcVar9 = "w+";
    pcStack_538 = (code *)0x10a816;
    ofp = (FILE *)fopen((char *)__filename_00,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      qt_hdr.n_hdr = 0;
      qt_line = 0;
      in_msg = '\0';
      pcStack_538 = (code *)0x10a853;
      pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
      if (pcVar9 != (char *)0x0) {
        unaff_R12 = "%s %5d";
        unaff_R13 = acStack_520;
        unaff_RBP = &iStack_524;
        pmVar32 = msg_hdr;
        do {
          qt_line = qt_line + 1;
          __filename_03 = (qthdr *)(ulong)(uint)qt_line;
          if (in_line[0] != '#') {
            if (in_line[0] == '%') {
              if (in_line[1] == 'E') {
                iStack_524 = 0;
                if (in_msg == '\0') {
                  pcVar9 = "End record encountered before message - line %d\n";
LAB_0010aa84:
                  iStack_524 = 0;
                  pcStack_538 = (code *)0x10aa8e;
                  fprintf(_stderr,pcVar9,(ulong)(uint)qt_line);
                }
                else {
                  in_msg = '\0';
                }
              }
              else {
                if (in_line[1] != 'C') goto LAB_0010a9e0;
                iStack_524 = 0;
                if (in_msg != '\0') {
                  pcVar9 = "Control record encountered during message - line %d\n";
                  goto LAB_0010aa84;
                }
                in_msg = '\x01';
                pcStack_538 = (code *)0x10a8f1;
                iVar6 = __isoc99_sscanf(in_line + 4,"%s %5d",unaff_R13,unaff_RBP);
                if (iVar6 == 2) {
                  pcStack_538 = (code *)0x10a902;
                  iVar6 = get_hdr(unaff_R13);
                  if (iVar6 == 0) {
                    if (0xf < (long)qt_hdr.n_hdr) {
                      pcStack_538 = (code *)0x10aaaa;
                      do_questtxt_cold_4();
                      goto LAB_0010aa41;
                    }
                    __filename_03 = &qt_hdr;
                    pcStack_538 = (code *)0x10a937;
                    strncpy(qt_hdr.id[qt_hdr.n_hdr],unaff_R13,3);
                    lVar10 = (long)qt_hdr.n_hdr;
                    msg_hdr[lVar10].n_msg = 0;
                    qt_hdr.n_hdr = qt_hdr.n_hdr + 1;
                    qt_hdr.offset[lVar10] = 0;
                  }
                  pcStack_538 = (code *)0x10a967;
                  iVar6 = get_hdr(unaff_R13);
                  lVar10 = (long)(iVar6 + -1);
                  lVar12 = lVar10 * 0x2ee8 + 0x1203f8;
                  iVar6 = msg_hdr[lVar10].n_msg;
                  lVar22 = (long)iVar6;
                  if (0 < lVar22) {
                    lVar25 = 0;
                    do {
                      if (*(int *)(lVar12 + lVar25) == iStack_524) {
                        pcStack_538 = (code *)0x10aa9c;
                        do_questtxt_cold_3();
                        goto LAB_0010aa41;
                      }
                      lVar25 = lVar25 + 0x18;
                    } while (lVar22 * 0x18 != lVar25);
                    if (499 < iVar6) {
                      pcStack_538 = (code *)0x10aaa3;
                      do_questtxt_cold_2();
                      goto LAB_0010aa41;
                    }
                  }
                  msg_hdr[lVar10].n_msg = iVar6 + 1;
                  curr_msg = (qtmsg *)(lVar12 + lVar22 * 0x18);
                  curr_msg->msgnum = iStack_524;
                  curr_msg->delivery = in_line[2];
                  curr_msg->offset = 0;
                  curr_msg->size = 0;
                }
                else {
                  pcStack_538 = (code *)0x10aa95;
                  do_questtxt_cold_1();
                }
              }
            }
            else {
LAB_0010a9e0:
              if (in_msg == '\0') {
                pcStack_538 = (code *)0x10aa06;
                sVar13 = strlen(in_line);
                if (sVar13 == 1) goto LAB_0010aa41;
                pcStack_538 = (code *)0x10aa27;
                fprintf(_stderr,"Text encountered outside message - line %d\n",__filename_03);
              }
              pcStack_538 = (code *)0x10a9f1;
              sVar13 = strlen(in_line);
              curr_msg->size = curr_msg->size + sVar13;
            }
          }
LAB_0010aa41:
          pcStack_538 = (code *)0x10aa55;
          pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
          __filename_00 = (msghdr *)in_line;
        } while (pcVar9 != (char *)0x0);
      }
      pcStack_538 = (code *)0x10aabc;
      fseek((FILE *)ifp,0,0);
      in_msg = '\0';
      lVar10 = (long)qt_hdr.n_hdr;
      if (0 < lVar10) {
        plVar23 = qt_hdr.offset;
        lVar12 = lVar10 * 0xb + 4;
        lVar22 = 0;
        do {
          *plVar23 = lVar12;
          lVar12 = lVar12 + (long)*(int *)((long)msg_hdr[0].qt_msg + lVar22 + -8) * 0x18 + 4;
          lVar22 = lVar22 + 0x2ee8;
          plVar23 = plVar23 + 1;
        } while (lVar10 * 0x2ee8 - lVar22 != 0);
        lVar22 = 0x120408;
        lVar25 = 0;
        lVar26 = 0;
        do {
          iVar6 = msg_hdr[lVar25].n_msg;
          if (0 < (long)iVar6) {
            lVar27 = 0;
            do {
              *(long *)(lVar22 + -8 + lVar27) = lVar26 + lVar12;
              lVar26 = lVar26 + *(long *)(lVar22 + lVar27);
              lVar27 = lVar27 + 0x18;
            } while ((long)iVar6 * 0x18 != lVar27);
          }
          lVar25 = lVar25 + 1;
          lVar22 = lVar22 + 0x2ee8;
        } while (lVar25 != lVar10);
      }
      pcVar9 = (char *)0x4;
      pcStack_538 = (code *)0x10ab83;
      sVar13 = fwrite(&qt_hdr,4,1,(FILE *)ofp);
      if ((int)sVar13 == 1) {
        pcVar9 = (char *)0x3;
        pcStack_538 = (code *)0x10abab;
        sVar13 = fwrite(qt_hdr.id,3,(long)qt_hdr.n_hdr,(FILE *)ofp);
        if (qt_hdr.n_hdr == (int)sVar13) {
          pcVar9 = (char *)0x8;
          pcStack_538 = (code *)0x10abd2;
          sVar13 = fwrite(qt_hdr.offset,8,(long)(int)sVar13,(FILE *)ofp);
          if (qt_hdr.n_hdr == (int)sVar13) {
            if (0 < (int)sVar13) {
              __filename_00 = msg_hdr;
              __filename_03 = (qthdr *)0x0;
              do {
                pcVar9 = (char *)0x4;
                pcStack_538 = (code *)0x10ac05;
                sVar13 = fwrite(__filename_00,4,1,(FILE *)ofp);
                if ((int)sVar13 != 1) goto LAB_0010ad5f;
                pcVar9 = (char *)0x18;
                pcStack_538 = (code *)0x10ac26;
                sVar13 = fwrite(__filename_00->qt_msg,0x18,(long)__filename_00->n_msg,(FILE *)ofp);
                if (__filename_00->n_msg != (int)sVar13) goto LAB_0010ad5f;
                __filename_03 = (qthdr *)((long)&__filename_03->n_hdr + 1);
                __filename_00 = __filename_00 + 1;
              } while ((long)__filename_03 < (long)qt_hdr.n_hdr);
            }
            pcStack_538 = (code *)0x10ac5c;
            pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
            bVar21 = in_line[0];
            do {
              in_line[0] = bVar21;
              if (pcVar9 == (char *)0x0) {
                pcStack_538 = (code *)0x10ad41;
                fclose((FILE *)ifp);
                pcStack_538 = (code *)0x10ad4d;
                fclose((FILE *)ofp);
                return;
              }
              if (bVar21 != 0x23) {
                if ((bVar21 == 0x25) && ((in_line[1] == 'E' || (in_line[1] == 'C')))) {
                  in_msg = in_line[1] == 'C';
                }
                else {
                  if (in_msg == '\0') {
                    pcStack_538 = (code *)0x10acc7;
                    sVar13 = strlen(in_line);
                    if (sVar13 == 1) goto LAB_0010ad18;
                  }
                  pbVar14 = &xcrypt_buf;
                  if (bVar21 != 0) {
                    iVar6 = 1;
                    pcVar9 = in_line;
                    pbVar14 = &xcrypt_buf;
                    do {
                      pcVar9 = (char *)((byte *)pcVar9 + 1);
                      bVar20 = (byte)iVar6;
                      if ((bVar21 & 0x60) == 0) {
                        bVar20 = 0;
                      }
                      *pbVar14 = bVar20 ^ bVar21;
                      iVar6 = iVar6 * 2;
                      if (0x1f < iVar6) {
                        iVar6 = 1;
                      }
                      pbVar14 = pbVar14 + 1;
                      bVar21 = *pcVar9;
                    } while (bVar21 != 0);
                  }
                  *pbVar14 = 0;
                  pcStack_538 = (code *)0x10ad18;
                  fputs(&xcrypt_buf,(FILE *)ofp);
                }
              }
LAB_0010ad18:
              pcStack_538 = (code *)0x10ad2c;
              pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
              bVar21 = in_line[0];
            } while( true );
          }
        }
      }
LAB_0010ad5f:
      pcStack_538 = (code *)0x10ad64;
      do_questtxt_cold_5();
      goto LAB_0010ad64;
    }
  }
  pcStack_538 = do_rumors;
  __filename_04 = __filename_00;
  do_questtxt_cold_6();
  pcStack_570 = (code *)0x10ad97;
  pcStack_568 = extraout_RAX_00;
  pmStack_560 = __filename_00;
  pcStack_558 = unaff_R12;
  pcStack_550 = unaff_R13;
  pqStack_548 = __filename_03;
  pmStack_540 = pmVar32;
  pcStack_538 = (code *)unaff_RBP;
  ofp = (FILE *)fopen(__filename,"w+");
  pcVar31 = __filename;
  if ((FILE *)ofp == (FILE *)0x0) {
    pcStack_570 = (code *)0x10afc3;
    do_rumors_cold_3();
LAB_0010afc3:
    pcStack_570 = (code *)0x10afcf;
    do_rumors_cold_2();
  }
  else {
    pcStack_570 = (code *)0x10adba;
    pcStack_568 = __filename;
    fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
    pcStack_570 = (code *)0x10adc9;
    ifp = (FILE *)fopen((char *)__filename_04,"r");
    if ((FILE *)ifp == (FILE *)0x0) goto LAB_0010afc3;
    unaff_R13 = (char *)0x0;
    pcStack_570 = (code *)0x10adeb;
    fseek((FILE *)ifp,0,2);
    pcStack_570 = (code *)0x10adf7;
    lVar10 = ftell((FILE *)ifp);
    pcStack_570 = (code *)0x10ae0f;
    fprintf((FILE *)ofp,"%06lx\n",lVar10);
    pcStack_570 = (code *)0x10ae1f;
    fseek((FILE *)ifp,0,0);
    pcStack_570 = (code *)0x10ae37;
    pcVar11 = fgets(in_line,0x100,(FILE *)ifp);
    if (pcVar11 != (char *)0x0) {
      __filename_04 = (msghdr *)&xcrypt_buf;
      unaff_R12 = in_line;
      unaff_RBP = (int *)(in_line + 1);
      pcVar31 = (char *)0x1;
      do {
        pbVar14 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar6 = 1;
          pcVar11 = in_line;
          pbVar14 = &xcrypt_buf;
          bVar21 = in_line[0];
          do {
            pcVar11 = (char *)((byte *)pcVar11 + 1);
            bVar20 = (byte)iVar6;
            if ((bVar21 & 0x60) == 0) {
              bVar20 = 0;
            }
            *pbVar14 = bVar20 ^ bVar21;
            iVar6 = iVar6 * 2;
            if (0x1f < iVar6) {
              iVar6 = 1;
            }
            pbVar14 = pbVar14 + 1;
            bVar21 = *pcVar11;
          } while (bVar21 != 0);
        }
        *pbVar14 = 0;
        pcStack_570 = (code *)0x10aeac;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_570 = (code *)0x10aec0;
        pcVar11 = fgets(in_line,0x100,(FILE *)ifp);
      } while (pcVar11 != (char *)0x0);
    }
    pcStack_570 = (code *)0x10aed1;
    fclose((FILE *)ifp);
    pcStack_570 = (code *)0x10aee0;
    ifp = (FILE *)fopen(pcVar9,"r");
    if ((FILE *)ifp != (FILE *)0x0) {
      pcStack_570 = (code *)0x10af04;
      pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
      bVar21 = in_line[0];
      while (in_line[0] = bVar21, pcVar9 != (char *)0x0) {
        pbVar14 = &xcrypt_buf;
        if (bVar21 != 0) {
          iVar6 = 1;
          pcVar9 = in_line;
          pbVar14 = &xcrypt_buf;
          do {
            pcVar9 = (char *)((byte *)pcVar9 + 1);
            bVar20 = (byte)iVar6;
            if ((bVar21 & 0x60) == 0) {
              bVar20 = 0;
            }
            *pbVar14 = bVar20 ^ bVar21;
            iVar6 = iVar6 * 2;
            if (0x1f < iVar6) {
              iVar6 = 1;
            }
            pbVar14 = pbVar14 + 1;
            bVar21 = *pcVar9;
          } while (bVar21 != 0);
        }
        *pbVar14 = 0;
        pcStack_570 = (code *)0x10af7c;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_570 = (code *)0x10af90;
        pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
        bVar21 = in_line[0];
      }
      pcStack_570 = (code *)0x10afa1;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_570 = do_oracles;
  pcVar11 = pcStack_568;
  __filename_02 = pcVar9;
  do_rumors_cold_1();
  pcStack_598 = pcVar31;
  pcStack_590 = unaff_R12;
  pcStack_588 = unaff_R13;
  pcStack_580 = pcVar9;
  pmStack_578 = __filename_04;
  pcStack_570 = (code *)unaff_RBP;
  sprintf(acStack_7a0,"%s.%s",pcVar11,"tmp");
  ifp = (FILE *)fopen(__filename_02,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010b4ec:
    do_oracles_cold_4();
  }
  else {
    ofp = (FILE *)fopen(pcVar11,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      tfp = (FILE *)fopen(acStack_7a0,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar5 = ofp;
        lVar10 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar5,"%05lx\n",lVar10);
        lVar10 = 0;
        do {
          pbVar14 = (byte *)special_oracle[lVar10];
          bVar21 = *pbVar14;
          pbVar17 = &xcrypt_buf;
          if (bVar21 != 0) {
            iVar6 = 1;
            pbVar17 = &xcrypt_buf;
            do {
              pbVar14 = pbVar14 + 1;
              bVar20 = (byte)iVar6;
              if ((bVar21 & 0x60) == 0) {
                bVar20 = 0;
              }
              *pbVar17 = bVar20 ^ bVar21;
              iVar6 = iVar6 * 2;
              if (0x1f < iVar6) {
                iVar6 = 1;
              }
              pbVar17 = pbVar17 + 1;
              bVar21 = *pbVar14;
            } while (bVar21 != 0);
          }
          *pbVar17 = 0;
          fputs(&xcrypt_buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 10);
        fputs("---\n",(FILE *)tfp);
        pFVar5 = ofp;
        lVar10 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar5,"%05lx\n",lVar10);
        uVar18 = 1;
LAB_0010b1a5:
        bVar3 = true;
LAB_0010b1a8:
        while (pcVar9 = fgets(in_line,0x100,(FILE *)ifp), pcVar9 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",alStack_6a0);
            if (in_line[4] == '-' &&
                CONCAT13(in_line[3],CONCAT12(in_line[2],CONCAT11(in_line[1],in_line[0]))) ==
                0x2d2d2d2d) goto code_r0x0010b1f4;
            pbVar14 = &xcrypt_buf;
            if (in_line[0] != '\0') {
              iVar6 = 1;
              pcVar9 = in_line;
              pbVar14 = &xcrypt_buf;
              bVar21 = in_line[0];
              do {
                pcVar9 = (char *)((byte *)pcVar9 + 1);
                bVar20 = (byte)iVar6;
                if ((bVar21 & 0x60) == 0) {
                  bVar20 = 0;
                }
                *pbVar14 = bVar20 ^ bVar21;
                iVar6 = iVar6 * 2;
                if (0x1f < iVar6) {
                  iVar6 = 1;
                }
                pbVar14 = pbVar14 + 1;
                bVar21 = *pcVar9;
              } while (bVar21 != 0);
            }
            *pbVar14 = 0;
            fputs(&xcrypt_buf,(FILE *)tfp);
            bVar3 = false;
          }
        }
        if (!bVar3) {
          uVar18 = uVar18 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar5 = ofp;
          lVar10 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar5,"%05lx\n",lVar10);
        }
        lVar10 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",acStack_7a0);
        iVar6 = fseek((FILE *)tfp,0,0);
        if (iVar6 == 0) {
          pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
          while (pcVar9 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
            pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
          }
          fclose((FILE *)tfp);
          unlink(acStack_7a0);
          sprintf(in_line,"rewind of \"%s\"",pcVar11);
          iVar6 = fseek((FILE *)ofp,0,0);
          if (iVar6 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",pcVar11);
            iVar6 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)uVar18);
            if (-1 < iVar6) {
              sprintf(in_line,"data rewrite of \"%s\"",pcVar11);
              iVar6 = uVar18 + 1;
              while ((((lVar12 = ftell((FILE *)ofp), -1 < lVar12 &&
                       (iVar8 = fseek((FILE *)ofp,lVar12,0), -1 < iVar8)) &&
                      (iVar8 = __isoc99_fscanf(ofp,"%5lx",alStack_6a0), iVar8 == 1)) &&
                     ((iVar8 = fseek((FILE *)ofp,lVar12,0), -1 < iVar8 &&
                      (iVar8 = fprintf((FILE *)ofp,"%05lx\n",alStack_6a0[0] + lVar10), -1 < iVar8)))
                     )) {
                iVar6 = iVar6 + -1;
                if (iVar6 == 0) {
                  fclose((FILE *)ofp);
                  return;
                }
              }
            }
          }
        }
        do_oracles_cold_1();
        goto LAB_0010b4ec;
      }
      goto LAB_0010b4fc;
    }
  }
  do_oracles_cold_3();
LAB_0010b4fc:
  pcVar9 = acStack_7a0;
  do_oracles_cold_2();
  lVar10 = (long)qt_hdr.n_hdr;
  if (0 < lVar10) {
    __s2 = qt_hdr.id;
    lVar12 = 0;
    do {
      iVar6 = strncmp(pcVar9,*__s2,3);
      if (iVar6 == 0) {
        return;
      }
      lVar12 = lVar12 + 1;
      __s2 = __s2 + 1;
    } while (lVar10 != lVar12);
  }
  return;
code_r0x0010b1f4:
  bVar2 = !bVar3;
  bVar3 = true;
  if (bVar2) goto LAB_0010b26f;
  goto LAB_0010b1a8;
LAB_0010b26f:
  uVar18 = uVar18 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar5 = ofp;
  lVar10 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar5,"%05lx\n",lVar10);
  goto LAB_0010b1a5;
}

Assistant:

void do_data(const char *infile, const char *outfile)
{
	char	tempfile[256];
	boolean ok;
	long	txt_offset;
	int	entry_cnt, line_cnt;

	sprintf(tempfile, "%s.%s", outfile, "tmp");

	if (!(ifp = fopen(infile, RDTMODE))) {		/* data.base */
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {	/* data */
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}
	if (!(tfp = fopen(tempfile, WRTMODE))) {	/* data.tmp */
		perror(tempfile);
		fclose(ifp);
		fclose(ofp);
		unlink(outfile);
		exit(EXIT_FAILURE);
	}

	/* output a dummy header record; we'll rewind and overwrite it later */
	fprintf(ofp, "%s%08lx\n", Dont_Edit_Data, 0L);

	entry_cnt = line_cnt = 0;
	/* read through the input file and split it into two sections */
	while (fgets(in_line, sizeof in_line, ifp)) {
	    if (d_filter(in_line)) continue;
	    if (*in_line > ' ') {	/* got an entry name */
		/* first finish previous entry */
		if (line_cnt)  fprintf(ofp, "%d\n", line_cnt),  line_cnt = 0;
		/* output the entry name */
		fputs(in_line, ofp);
		entry_cnt++;		/* update number of entries */
	    } else if (entry_cnt) {	/* got some descriptive text */
		/* update previous entry with current text offset */
		if (!line_cnt)  fprintf(ofp, "%ld,", ftell(tfp));
		/* save the text line in the scratch file */
		fputs(in_line, tfp);
		line_cnt++;		/* update line counter */
	    }
	}
	/* output an end marker and then record the current position */
	if (line_cnt)  fprintf(ofp, "%d\n", line_cnt);
	fprintf(ofp, ".\n%ld,%d\n", ftell(tfp), 0);
	txt_offset = ftell(ofp);
	fclose(ifp);		/* all done with original input file */

	/* reprocess the scratch file; 1st format an error msg, just in case */
	sprintf(in_line, "rewind of \"%s\"", tempfile);
	if (rewind(tfp) != 0)  goto dead_data;
	/* copy all lines of text from the scratch file into the output file */
	while (fgets(in_line, sizeof in_line, tfp))
	    fputs(in_line, ofp);

	/* finished with scratch file */
	fclose(tfp);
	unlink(tempfile);	/* remove it */

	/* update the first record of the output file; prepare error msg 1st */
	sprintf(in_line, "rewind of \"%s\"", outfile);
	ok = (rewind(ofp) == 0);
	if (ok) {
	   sprintf(in_line, "header rewrite of \"%s\"", outfile);
	   ok = (fprintf(ofp, "%s%08lx\n", Dont_Edit_Data, txt_offset) >= 0);
	}
	if (!ok) {
dead_data:  perror(in_line);	/* report the problem */
	    /* close and kill the aborted output file, then give up */
	    fclose(ofp);
	    unlink(outfile);
	    exit(EXIT_FAILURE);
	}

	/* all done */
	fclose(ofp);

	return;
}